

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::ArrayColumnWriter::Prepare
          (ArrayColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  vector<bool,_true> *this_00;
  pointer *ppuVar1;
  unsigned_short uVar2;
  iterator iVar3;
  pointer puVar4;
  unsigned_long *puVar5;
  ParquetColumnSchema *pPVar6;
  idx_t iVar7;
  Vector *pVVar8;
  pointer pCVar9;
  type pCVar10;
  unsigned_short *puVar11;
  unsigned_short uVar12;
  idx_t iVar13;
  long lVar14;
  size_type __n;
  reference rVar15;
  unsigned_short local_82;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_80;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_78;
  idx_t local_70;
  long local_68;
  Vector *local_60;
  ulong local_58;
  idx_t local_50;
  vector<bool,_true> *local_48;
  idx_t local_40;
  idx_t local_38;
  
  local_70 = ArrayType::GetSize(&vector->type);
  local_60 = vector;
  FlatVector::VerifyFlatVector(vector);
  iVar13 = count;
  if (parent != (ColumnWriterState *)0x0) {
    iVar13 = ((long)(parent->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(parent->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start >> 1) -
             (long)state_p[1].definition_levels.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  }
  local_50 = count;
  if (iVar13 != 0) {
    local_48 = &parent->is_empty;
    local_78 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state_p->definition_levels;
    local_80 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state_p->repetition_levels;
    this_00 = &state_p->is_empty;
    local_68 = local_70 - 1;
    local_58 = 0;
    iVar7 = 0;
    local_40 = iVar13;
    do {
      local_38 = iVar7;
      if (parent == (ColumnWriterState *)0x0) {
        uVar12 = (unsigned_short)
                 ((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->max_repeat;
LAB_01132243:
        puVar5 = (local_60->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) ||
           ((puVar5[local_58 >> 6] >> (local_58 & 0x3f) & 1) != 0)) {
          iVar3._M_current =
               (state_p->definition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      (local_78,iVar3,&ColumnWriter::PARQUET_DEFINE_VALID);
          }
          else {
            *iVar3._M_current = 0xffff;
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_00,false);
          iVar3._M_current =
               (state_p->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (state_p->repetition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_82 = uVar12;
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3,
                       &local_82);
          }
          else {
            *iVar3._M_current = uVar12;
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            local_82 = uVar12;
          }
          lVar14 = local_68;
          if (1 < local_70) {
            do {
              local_82 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.
                                     column_schema)->max_repeat + 1;
              iVar3._M_current =
                   (state_p->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3
                           ,&local_82);
              }
              else {
                *iVar3._M_current = local_82;
                (state_p->repetition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              iVar3._M_current =
                   (state_p->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          (local_78,iVar3,&ColumnWriter::PARQUET_DEFINE_VALID);
              }
              else {
                *iVar3._M_current = 0xffff;
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              ::std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)this_00,false);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
        }
        else {
          local_82 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                                 max_define - 1;
          iVar3._M_current =
               (state_p->definition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_78,iVar3,
                       &local_82);
          }
          else {
            *iVar3._M_current = local_82;
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar3._M_current =
               (state_p->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (state_p->repetition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_82 = uVar12;
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3,
                       &local_82);
          }
          else {
            *iVar3._M_current = uVar12;
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            local_82 = uVar12;
          }
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_00,false);
          lVar14 = local_68;
          if (1 < local_70) {
            do {
              pPVar6 = (this->super_ListColumnWriter).super_ColumnWriter.column_schema;
              local_82 = (short)(int)pPVar6->max_repeat + 1;
              iVar3._M_current =
                   (state_p->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3
                           ,&local_82);
                pPVar6 = (this->super_ListColumnWriter).super_ColumnWriter.column_schema;
              }
              else {
                *iVar3._M_current = local_82;
                (state_p->repetition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              local_82 = (short)(int)pPVar6->max_define - 1;
              iVar3._M_current =
                   (state_p->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_78,iVar3
                           ,&local_82);
              }
              else {
                *iVar3._M_current = local_82;
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              ::std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)this_00,false);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
        }
LAB_0113255c:
        local_58 = local_58 + 1;
        iVar13 = local_40;
      }
      else {
        __n = (long)state_p[1].definition_levels.
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + iVar7;
        if ((((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p ==
              (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p) &&
            ((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset == 0)) ||
           (rVar15 = vector<bool,_true>::get<true>(local_48,__n),
           (*rVar15._M_p & rVar15._M_mask) == 0)) {
          puVar4 = (parent->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar4 == (parent->repetition_levels).
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            uVar12 = (unsigned_short)
                     ((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->max_repeat;
          }
          else {
            uVar12 = puVar4[__n];
          }
          puVar4 = (parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = puVar4[__n];
          if (uVar2 == 0xffff) goto LAB_01132243;
          iVar3._M_current =
               (state_p->definition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>(local_78,iVar3,puVar4 + __n);
          }
          else {
            *iVar3._M_current = uVar2;
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar3._M_current =
               (state_p->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_82 = uVar12;
          if (iVar3._M_current ==
              (state_p->repetition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3,
                       &local_82);
          }
          else {
            *iVar3._M_current = uVar12;
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_00,false);
          lVar14 = local_68;
          if (1 < local_70) {
            do {
              local_82 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.
                                     column_schema)->max_repeat + 1;
              iVar3._M_current =
                   (state_p->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,iVar3
                           ,&local_82);
              }
              else {
                *iVar3._M_current = local_82;
                (state_p->repetition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              puVar11 = (parent->definition_levels).
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + __n;
              iVar3._M_current =
                   (state_p->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (state_p->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>(local_78,iVar3,puVar11);
              }
              else {
                *iVar3._M_current = *puVar11;
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              ::std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)this_00,false);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          goto LAB_0113255c;
        }
        puVar11 = (parent->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start + __n;
        iVar3._M_current =
             (state_p->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>(local_78,iVar3,puVar11);
        }
        else {
          *iVar3._M_current = *puVar11;
          (state_p->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
          .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        puVar11 = (parent->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start + __n;
        iVar3._M_current =
             (state_p->repetition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>(local_80,iVar3,puVar11);
        }
        else {
          *iVar3._M_current = *puVar11;
          (state_p->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
          .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_00,true);
      }
      iVar7 = local_38 + 1;
    } while (iVar7 != iVar13);
  }
  ppuVar1 = &state_p[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  *ppuVar1 = (pointer)((long)*ppuVar1 + iVar13);
  pVVar8 = ArrayVector::GetEntry(local_60);
  pCVar9 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
           operator->(&(this->super_ListColumnWriter).child_writer);
  pCVar10 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
            ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                         *)&state_p[1].definition_levels.
                            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
  (*pCVar9->_vptr_ColumnWriter[6])(pCVar9,pCVar10,state_p,pVVar8,local_70 * local_50);
  return;
}

Assistant:

void ArrayColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<ListColumnWriterState>();

	auto array_size = ArrayType::GetSize(vector.GetType());
	auto &validity = FlatVector::Validity(vector);

	// write definition levels and repeats
	// the main difference between this and ListColumnWriter::Prepare is that we need to make sure to write out
	// repetition levels and definitions for the child elements of the array even if the array itself is NULL.
	idx_t start = 0;
	idx_t vcount = parent ? parent->definition_levels.size() - state.parent_index : count;
	idx_t vector_index = 0;
	for (idx_t i = start; i < vcount; i++) {
		idx_t parent_index = state.parent_index + i;
		if (parent && !parent->is_empty.empty() && parent->is_empty[parent_index]) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(parent->repetition_levels[parent_index]);
			state.is_empty.push_back(true);
			continue;
		}
		auto first_repeat_level =
		    parent && !parent->repetition_levels.empty() ? parent->repetition_levels[parent_index] : MaxRepeat();
		if (parent && parent->definition_levels[parent_index] != PARQUET_DEFINE_VALID) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(parent->definition_levels[parent_index]);
				state.is_empty.push_back(false);
			}
		} else if (validity.RowIsValid(vector_index)) {
			// push the repetition levels
			state.definition_levels.push_back(PARQUET_DEFINE_VALID);
			state.is_empty.push_back(false);

			state.repetition_levels.push_back(first_repeat_level);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
		} else {
			state.definition_levels.push_back(MaxDefine() - 1);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(MaxDefine() - 1);
				state.is_empty.push_back(false);
			}
		}
		vector_index++;
	}
	state.parent_index += vcount;

	auto &array_child = ArrayVector::GetEntry(vector);
	child_writer->Prepare(*state.child_state, &state_p, array_child, count * array_size);
}